

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

Vec4 __thiscall tcu::sRGBToLinear(tcu *this,Vec4 *cs)

{
  float *pfVar1;
  float x_;
  float y_;
  float z_;
  undefined8 extraout_XMM0_Qa;
  ulong uVar2;
  Vec4 VVar3;
  Vec4 *cs_local;
  
  pfVar1 = Vector<float,_4>::operator[](cs,0);
  x_ = sRGBChannelToLinear(*pfVar1);
  pfVar1 = Vector<float,_4>::operator[](cs,1);
  y_ = sRGBChannelToLinear(*pfVar1);
  pfVar1 = Vector<float,_4>::operator[](cs,2);
  z_ = sRGBChannelToLinear(*pfVar1);
  pfVar1 = Vector<float,_4>::operator[](cs,3);
  uVar2 = (ulong)(uint)y_;
  Vector<float,_4>::Vector((Vector<float,_4> *)this,x_,y_,z_,*pfVar1);
  VVar3.m_data[2] = (float)(int)uVar2;
  VVar3.m_data[3] = (float)(int)(uVar2 >> 0x20);
  VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar3.m_data;
}

Assistant:

Vec4 sRGBToLinear (const Vec4& cs)
{
	return Vec4(sRGBChannelToLinear(cs[0]),
				sRGBChannelToLinear(cs[1]),
				sRGBChannelToLinear(cs[2]),
				cs[3]);
}